

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int pager_get_page_contents(Pager *pPager,Page *pPage,int noContent)

{
  uchar *zMap;
  int rc;
  int noContent_local;
  Page *pPage_local;
  Pager *pPager_local;
  
  zMap._0_4_ = 0;
  if (((pPager->is_mem == 0) && (noContent == 0)) && (pPage->pgno < pPager->dbSize)) {
    if (((pPager->iOpenFlags & 0x100) == 0) || (pPager->pMmap == (void *)0x0)) {
      zMap._0_4_ = unqliteOsRead(pPager->pfd,pPage->zData,(long)pPager->iPageSize,
                                 pPage->pgno * (long)pPager->iPageSize);
    }
    else {
      pPage->zData = (uchar *)((long)pPager->pMmap + pPage->pgno * (long)pPager->iPageSize);
    }
    pPager_local._4_4_ = (int)zMap;
  }
  else {
    SyZero(pPage->zData,pPager->iPageSize);
    pPager_local._4_4_ = 0;
  }
  return pPager_local._4_4_;
}

Assistant:

static int pager_get_page_contents(Pager *pPager,Page *pPage,int noContent)
{
	int rc = UNQLITE_OK;
	if( pPager->is_mem || noContent || pPage->pgno >= pPager->dbSize ){
		/* Do not bother reading, zero the page contents only */
		SyZero(pPage->zData,pPager->iPageSize);
		return UNQLITE_OK;
	}
	if( (pPager->iOpenFlags & UNQLITE_OPEN_MMAP) && (pPager->pMmap /* Paranoid edition */) ){
		unsigned char *zMap = (unsigned char *)pPager->pMmap;
		pPage->zData = &zMap[pPage->pgno * pPager->iPageSize];
	}else{
		/* Read content */
		rc = unqliteOsRead(pPager->pfd,pPage->zData,pPager->iPageSize,pPage->pgno * pPager->iPageSize);
	}
	return rc;
}